

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

char __thiscall FIX::CharField::getValue(CharField *this)

{
  char cVar1;
  string *value;
  FieldConvertError *anon_var_0;
  CharField *this_local;
  
  value = FieldBase::getString_abi_cxx11_(&this->super_FieldBase);
  cVar1 = CharConvertor::convert(value);
  return cVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return CharConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }